

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

void __thiscall FIX::StringField::StringField(StringField *this,int field)

{
  allocator<char> local_39;
  string local_38;
  int local_14;
  StringField *pSStack_10;
  int field_local;
  StringField *this_local;
  
  local_14 = field;
  pSStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  FieldBase::FieldBase(&this->super_FieldBase,field,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  (this->super_FieldBase)._vptr_FieldBase = (_func_int **)&PTR__StringField_001b1230;
  return;
}

Assistant:

StringField( int field )
: FieldBase( field, "" ) {}